

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O0

bool __thiscall
s2textformat::InternalMakePolygon
          (s2textformat *this,string_view str,S2Debug debug_override,bool normalize_loops,
          unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_> *polygon)

{
  string_view x;
  bool bVar1;
  pointer pSVar2;
  undefined7 in_register_00000081;
  string_view str_00;
  string_view str_01;
  unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_> local_f0;
  int local_e8;
  s2textformat *local_d8;
  char *pcStack_d0;
  unique_ptr<S2Loop,_std::default_delete<S2Loop>_> local_c8;
  unique_ptr<S2Loop,_std::default_delete<S2Loop>_> loop;
  string_view *loop_str;
  iterator __end1;
  iterator __begin1;
  vector<absl::string_view,_std::allocator<absl::string_view>_> *__range1;
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  loops;
  undefined1 local_78 [8];
  vector<absl::string_view,_std::allocator<absl::string_view>_> loop_strs;
  char *local_58;
  string_view local_50;
  s2textformat *local_40;
  char *local_38;
  unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_> *local_30;
  unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_> *polygon_local;
  bool normalize_loops_local;
  pointer psStack_20;
  S2Debug debug_override_local;
  string_view str_local;
  
  local_38 = str.ptr_;
  polygon_local._7_1_ = (byte)str.length_;
  polygon_local._6_1_ = debug_override & DISABLE;
  local_30 = (unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_> *)
             CONCAT71(in_register_00000081,normalize_loops);
  local_40 = this;
  psStack_20 = (pointer)this;
  str_local.ptr_ = local_38;
  absl::string_view::string_view(&local_50,"empty");
  x.length_ = (size_type)local_38;
  x.ptr_ = (char *)local_40;
  bVar1 = absl::operator==(x,local_50);
  if (bVar1) {
    absl::string_view::string_view
              ((string_view *)
               &loop_strs.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,"");
    psStack_20 = loop_strs.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    str_local.ptr_ = local_58;
  }
  loops.
  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)psStack_20;
  str_01.length_ = 0x3b;
  str_01.ptr_ = str_local.ptr_;
  SplitString((vector<absl::string_view,_std::allocator<absl::string_view>_> *)local_78,
              (s2textformat *)psStack_20,str_01,normalize_loops);
  std::
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ::vector((vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
            *)&__range1);
  __end1 = std::vector<absl::string_view,_std::allocator<absl::string_view>_>::begin
                     ((vector<absl::string_view,_std::allocator<absl::string_view>_> *)local_78);
  loop_str = (string_view *)
             std::vector<absl::string_view,_std::allocator<absl::string_view>_>::end
                       ((vector<absl::string_view,_std::allocator<absl::string_view>_> *)local_78);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<absl::string_view_*,_std::vector<absl::string_view,_std::allocator<absl::string_view>_>_>
                                     *)&loop_str), bVar1) {
    loop._M_t.super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t.
    super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
    super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl =
         (__uniq_ptr_data<S2Loop,_std::default_delete<S2Loop>,_true,_true>)
         __gnu_cxx::
         __normal_iterator<absl::string_view_*,_std::vector<absl::string_view,_std::allocator<absl::string_view>_>_>
         ::operator*(&__end1);
    std::unique_ptr<S2Loop,std::default_delete<S2Loop>>::
    unique_ptr<std::default_delete<S2Loop>,void>
              ((unique_ptr<S2Loop,std::default_delete<S2Loop>> *)&local_c8);
    local_d8 = *(s2textformat **)
                loop._M_t.super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t.
                super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl;
    pcStack_d0 = *(char **)((long)loop._M_t.
                                  super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t.
                                  super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                                  super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 8);
    str_00.length_ = (size_type)&local_c8;
    str_00.ptr_ = pcStack_d0;
    bVar1 = MakeLoop(local_d8,str_00,
                     (unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *)(ulong)polygon_local._7_1_,
                     normalize_loops);
    if (bVar1) {
      if ((polygon_local._6_1_ & DISABLE) != ALLOW) {
        pSVar2 = std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>::operator->(&local_c8);
        bVar1 = S2Loop::is_full(pSVar2);
        if (!bVar1) {
          pSVar2 = std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>::operator->(&local_c8);
          S2Loop::Normalize(pSVar2);
        }
      }
      std::
      vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
      ::push_back((vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                   *)&__range1,&local_c8);
      local_e8 = 0;
    }
    else {
      str_local.length_._7_1_ = 0;
      local_e8 = 1;
    }
    std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>::~unique_ptr(&local_c8);
    if (local_e8 != 0) goto LAB_0050f625;
    __gnu_cxx::
    __normal_iterator<absl::string_view_*,_std::vector<absl::string_view,_std::allocator<absl::string_view>_>_>
    ::operator++(&__end1);
  }
  absl::
  make_unique<S2Polygon,std::vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>,S2Debug&>
            ((absl *)&local_f0,
             (vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
              *)&__range1,(S2Debug *)((long)&polygon_local + 7));
  std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>::operator=(local_30,&local_f0);
  std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>::~unique_ptr(&local_f0);
  str_local.length_._7_1_ = 1;
  local_e8 = 1;
LAB_0050f625:
  std::
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ::~vector((vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
             *)&__range1);
  std::vector<absl::string_view,_std::allocator<absl::string_view>_>::~vector
            ((vector<absl::string_view,_std::allocator<absl::string_view>_> *)local_78);
  return (bool)(str_local.length_._7_1_ & 1);
}

Assistant:

static bool InternalMakePolygon(string_view str,
                                S2Debug debug_override,
                                bool normalize_loops,
                                unique_ptr<S2Polygon>* polygon) {
  if (str == "empty") str = "";
  vector<string_view> loop_strs = SplitString(str, ';');
  vector<unique_ptr<S2Loop>> loops;
  for (const auto& loop_str : loop_strs) {
    std::unique_ptr<S2Loop> loop;
    if (!MakeLoop(loop_str, &loop, debug_override)) return false;
    // Don't normalize loops that were explicitly specified as "full".
    if (normalize_loops && !loop->is_full()) loop->Normalize();
    loops.push_back(std::move(loop));
  }
  *polygon = make_unique<S2Polygon>(std::move(loops), debug_override);
  return true;
}